

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-info.cpp
# Opt level: O2

FileInfoWrapper<AS_02::ACES::MXFReader,_MyACESPictureDescriptor> * __thiscall
FileInfoWrapper<AS_02::ACES::MXFReader,_MyACESPictureDescriptor>::file_info
          (FileInfoWrapper<AS_02::ACES::MXFReader,_MyACESPictureDescriptor> *this,
          CommandOptions *Options,char *type_string,FILE *stream)

{
  PathList_t *Options_00;
  size_t *this_00;
  uint uVar1;
  char *pcVar2;
  FILE *in_R8;
  char *pcVar3;
  undefined1 local_100 [104];
  
  if (stream != (FILE *)0x0) {
    if (in_R8 == (_IO_FILE *)0x0) {
      in_R8 = _stdout;
    }
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    Options_00 = &Options->filenames;
    OpenRead<AS_02::ACES::MXFReader>
              ((FileInfoWrapper<AS_02::ACES::MXFReader,_MyACESPictureDescriptor> *)local_100,
               (MXFReader *)Options,(CommandOptions *)Options_00);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_100);
    Kumu::Result_t::~Result_t((Result_t *)local_100);
    if (*(int *)&this->_vptr_FileInfoWrapper < 0) {
      if ((*(int *)&this->_vptr_FileInfoWrapper == ASDCP::RESULT_FORMAT) &&
         (type_string[0x21] == '\x01')) {
        AS_02::ACES::MXFReader::DumpHeaderMetadata((_IO_FILE *)Options_00);
      }
    }
    else {
      this_00 = &(Options->filenames).
                 super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl._M_node._M_size;
      MyACESPictureDescriptor::FillDescriptor
                ((MyACESPictureDescriptor *)this_00,(MXFReader *)Options_00);
      AS_02::ACES::MXFReader::FillWriterInfo((WriterInfo *)&stack0xffffffffffffff68);
      Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff68);
      uVar1._0_1_ = Options->showindex_flag;
      uVar1._1_1_ = Options->showheader_flag;
      uVar1._2_1_ = Options->showid_flag;
      uVar1._3_1_ = Options->showdescriptor_flag;
      pcVar2 = "Unknown";
      if ((int)Options[8].filenames.
               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl._M_node._M_size == 2) {
        pcVar2 = "SMPTE 2067-5";
      }
      pcVar3 = "s";
      if ((ulong)uVar1 == 1) {
        pcVar3 = "";
      }
      fprintf(_stdout,"%s file essence type is %s, (%llu edit unit%s).\n",pcVar2,stream,(ulong)uVar1
              ,pcVar3);
      if (type_string[0x21] == '\x01') {
        AS_02::ACES::MXFReader::DumpHeaderMetadata((_IO_FILE *)Options_00);
      }
      if (type_string[0x22] == '\x01') {
        ASDCP::WriterInfoDump((WriterInfo *)(Options + 5),in_R8);
      }
      if (type_string[0x23] == '\x01') {
        MyACESPictureDescriptor::MyDump((MyACESPictureDescriptor *)this_00,(FILE *)in_R8);
      }
      if (type_string[0x20] == '\x01') {
        AS_02::ACES::MXFReader::DumpIndex((_IO_FILE *)Options_00);
      }
    }
    return this;
  }
  __assert_fail("type_string",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/as-02-info.cpp"
                ,0x308,
                "Result_t FileInfoWrapper<AS_02::ACES::MXFReader, MyACESPictureDescriptor>::file_info(CommandOptions &, const char *, FILE *) [ReaderT = AS_02::ACES::MXFReader, DescriptorT = MyACESPictureDescriptor]"
               );
}

Assistant:

Result_t
  file_info(CommandOptions& Options, const char* type_string, FILE* stream = 0)
  {
    assert(type_string);
    if ( stream == 0 )
      {
	stream = stdout;
      }

    Result_t result = RESULT_OK;
    result = OpenRead(m_Reader, Options);

    if ( ASDCP_SUCCESS(result) )
      {
	m_Desc.FillDescriptor(m_Reader);
	m_Reader.FillWriterInfo(m_WriterInfo);
        ui64_t container_duration = m_Desc.ContainerDuration;
	fprintf(stdout, "%s file essence type is %s, (%llu edit unit%s).\n",
		( m_WriterInfo.LabelSetType == LS_MXF_SMPTE ? "SMPTE 2067-5" : "Unknown" ),
		type_string,
		container_duration,
		(container_duration == ui64_C(1) ? "":"s"));

	if ( Options.showheader_flag )
	  {
	    m_Reader.DumpHeaderMetadata(stream);
	  }

	if ( Options.showid_flag )
	  {
	    WriterInfoDump(m_WriterInfo, stream);
	  }

	if ( Options.showdescriptor_flag )
	  {
	    m_Desc.MyDump(stream);
	  }

	if ( Options.showindex_flag )
	  {
	    m_Reader.DumpIndex(stream);
	  }
      }
    else if ( result == RESULT_FORMAT && Options.showheader_flag )
      {
	m_Reader.DumpHeaderMetadata(stream);
      }

    return result;
  }